

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
               *src,type alpha,bool add_to)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined7 in_register_00000011;
  long c;
  long lVar3;
  long lVar4;
  long r;
  long lVar5;
  type tVar6;
  undefined1 auVar7 [64];
  undefined1 extraout_var [60];
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    lVar4 = 0;
    lVar5 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      for (; lVar5 < (src->lhs->op).rows; lVar5 = lVar5 + 1) {
        for (lVar3 = 0; lVar3 < (src->rhs->data).nc_; lVar3 = lVar3 + 1) {
          tVar6 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                  ::operator()(src,lVar5,lVar3);
          *(float *)((long)dest->ptr + lVar3 * 4 + dest->width * lVar4) = tVar6 * alpha;
        }
        lVar4 = lVar4 + 4;
      }
    }
    else {
      for (; lVar5 < (src->lhs->op).rows; lVar5 = lVar5 + 1) {
        for (lVar3 = 0; lVar3 < (src->rhs->data).nc_; lVar3 = lVar3 + 1) {
          tVar6 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                  ::operator()(src,lVar5,lVar3);
          *(type *)((long)dest->ptr + lVar3 * 4 + dest->width * lVar4) = tVar6;
        }
        lVar4 = lVar4 + 4;
      }
    }
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      if ((alpha != -1.0) || (NAN(alpha))) {
        for (; lVar5 < (src->lhs->op).rows; lVar5 = lVar5 + 1) {
          for (lVar3 = 0; lVar3 < (src->rhs->data).nc_; lVar3 = lVar3 + 1) {
            auVar7._0_4_ = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                           ::operator()(src,lVar5,lVar3);
            auVar7._4_60_ = extraout_var;
            lVar2 = dest->width * lVar4;
            auVar1 = vfmadd213ss_fma(auVar7._0_16_,ZEXT416((uint)alpha),
                                     ZEXT416(*(uint *)((long)dest->ptr + lVar3 * 4 + lVar2)));
            *(int *)((long)dest->ptr + lVar3 * 4 + lVar2) = auVar1._0_4_;
          }
          lVar4 = lVar4 + 4;
        }
      }
      else {
        for (; lVar5 < (src->lhs->op).rows; lVar5 = lVar5 + 1) {
          for (lVar3 = 0; lVar3 < (src->rhs->data).nc_; lVar3 = lVar3 + 1) {
            tVar6 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                    ::operator()(src,lVar5,lVar3);
            lVar2 = dest->width * lVar4;
            *(float *)((long)dest->ptr + lVar3 * 4 + lVar2) =
                 *(float *)((long)dest->ptr + lVar3 * 4 + lVar2) - tVar6;
          }
          lVar4 = lVar4 + 4;
        }
      }
    }
    else {
      for (; lVar5 < (src->lhs->op).rows; lVar5 = lVar5 + 1) {
        for (lVar3 = 0; lVar3 < (src->rhs->data).nc_; lVar3 = lVar3 + 1) {
          tVar6 = matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                  ::operator()(src,lVar5,lVar3);
          lVar2 = dest->width * lVar4;
          *(float *)((long)dest->ptr + lVar3 * 4 + lVar2) =
               tVar6 + *(float *)((long)dest->ptr + lVar3 * 4 + lVar2);
        }
        lVar4 = lVar4 + 4;
      }
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }